

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  istream *piVar1;
  string order_data;
  CPU RISC_V_CPU;
  undefined1 *local_128;
  long local_120;
  undefined1 local_118;
  undefined7 uStack_117;
  string local_108;
  CPU local_e8;
  
  memory::memory(&local_e8.CPU_MEM,1000000);
  local_e8.Register[0x1c] = 0;
  local_e8.Register[0x1d] = 0;
  local_e8.Register[0x1e] = 0;
  local_e8.Register[0x1f] = 0;
  local_e8.Register[0x18] = 0;
  local_e8.Register[0x19] = 0;
  local_e8.Register[0x1a] = 0;
  local_e8.Register[0x1b] = 0;
  local_e8.Register[0x14] = 0;
  local_e8.Register[0x15] = 0;
  local_e8.Register[0x16] = 0;
  local_e8.Register[0x17] = 0;
  local_e8.Register[0x10] = 0;
  local_e8.Register[0x11] = 0;
  local_e8.Register[0x12] = 0;
  local_e8.Register[0x13] = 0;
  local_e8.Register[0xc] = 0;
  local_e8.Register[0xd] = 0;
  local_e8.Register[0xe] = 0;
  local_e8.Register[0xf] = 0;
  local_e8.Register[8] = 0;
  local_e8.Register[9] = 0;
  local_e8.Register[10] = 0;
  local_e8.Register[0xb] = 0;
  local_e8.Register[4] = 0;
  local_e8.Register[5] = 0;
  local_e8.Register[6] = 0;
  local_e8.Register[7] = 0;
  local_e8.Register[0] = 0;
  local_e8.Register[1] = 0;
  local_e8.Register[2] = 0;
  local_e8.Register[3] = 0;
  local_120 = 0;
  local_118 = 0;
  local_128 = &local_118;
  while( true ) {
    piVar1 = std::operator>>((istream *)&std::cin,(string *)&local_128);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_108,local_128,local_128 + local_120);
    memory::push(&local_e8.CPU_MEM,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  CPU::run(&local_e8);
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
  return 0;
}

Assistant:

int main() {
    CPU RISC_V_CPU;
    string order_data;
    int counter=0;
    while(cin>>order_data){
        RISC_V_CPU.CPU_MEM.push(order_data);
        ++counter;
    }
    RISC_V_CPU.run();
    return 0;
}